

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LIRMIA3.h
# Opt level: O2

int ConnectLIRMIA3(LIRMIA3 *pLIRMIA3,char *szCfgFilePath)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  FILE *__stream;
  char *pcVar6;
  long local_160;
  char line [256];
  
  memset(pLIRMIA3->szCfgFilePath,0,0x100);
  sprintf(pLIRMIA3->szCfgFilePath,"%.255s",szCfgFilePath);
  iVar4 = strncmp(szCfgFilePath,"hardcoded://",0xc);
  if (iVar4 != 0) {
    memset(line,0,0x100);
    memset(pLIRMIA3->szDevPath + 5,0,0xfb);
    builtin_strncpy(pLIRMIA3->szDevPath,"COM1",5);
    pLIRMIA3->BaudRate = 0x1c200;
    pLIRMIA3->timeout = 1000;
    pLIRMIA3->threadperiod = 0x32;
    pLIRMIA3->bSaveRawData = 1;
    for (lVar5 = -0x10; lVar5 != 0; lVar5 = lVar5 + 4) {
      *(undefined4 *)((long)pLIRMIA3->MidPWs + lVar5) = 1000;
      *(undefined4 *)((long)pLIRMIA3->MaxPWs + lVar5) = 0x5dc;
      *(undefined4 *)((long)pLIRMIA3->InitPWs + lVar5) = 2000;
      *(undefined4 *)((long)pLIRMIA3->ThresholdPWs + lVar5) = 0x5dc;
      *(undefined4 *)((long)pLIRMIA3->CoefPWs + lVar5) = 0;
      *(undefined8 *)((long)pLIRMIA3->bProportionalPWs + lVar5 * 2) = 0x3ff0000000000000;
      *(undefined4 *)((long)pLIRMIA3->bProportionalPWs + lVar5 + 0x10) = 1;
    }
    pLIRMIA3->rightthrusterchan = 3;
    pLIRMIA3->leftthrusterchan = 2;
    pLIRMIA3->frontthrusterchan = 0;
    pLIRMIA3->rearthrusterchan = 1;
    __stream = fopen(szCfgFilePath,"r");
    if (__stream == (FILE *)0x0) {
      puts("Configuration file not found.");
    }
    else {
      pcVar6 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar6 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar4 = __isoc99_sscanf(line,"%255s",pLIRMIA3->szDevPath);
      if (iVar4 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar6 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar6 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar4 = __isoc99_sscanf(line,"%d",&pLIRMIA3->BaudRate);
      if (iVar4 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar6 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar6 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar4 = __isoc99_sscanf(line,"%d",&pLIRMIA3->timeout);
      if (iVar4 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar6 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar6 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar4 = __isoc99_sscanf(line,"%d",&pLIRMIA3->threadperiod);
      if (iVar4 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar6 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar6 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar4 = __isoc99_sscanf(line,"%d",&pLIRMIA3->bSaveRawData);
      if (iVar4 != 1) {
        puts("Invalid configuration file.");
      }
      local_160 = 0x590;
      for (lVar5 = 0; pcVar6 = fgets3((FILE *)__stream,line,0x100), lVar5 != 0x10; lVar5 = lVar5 + 4
          ) {
        if (pcVar6 == (char *)0x0) {
          puts("Invalid configuration file.");
        }
        iVar4 = __isoc99_sscanf(line,"%d",(long)pLIRMIA3->MinPWs + lVar5);
        if (iVar4 != 1) {
          puts("Invalid configuration file.");
        }
        pcVar6 = fgets3((FILE *)__stream,line,0x100);
        if (pcVar6 == (char *)0x0) {
          puts("Invalid configuration file.");
        }
        iVar4 = __isoc99_sscanf(line,"%d",(long)pLIRMIA3->MidPWs + lVar5);
        if (iVar4 != 1) {
          puts("Invalid configuration file.");
        }
        pcVar6 = fgets3((FILE *)__stream,line,0x100);
        if (pcVar6 == (char *)0x0) {
          puts("Invalid configuration file.");
        }
        iVar4 = __isoc99_sscanf(line,"%d",(long)pLIRMIA3->MaxPWs + lVar5);
        if (iVar4 != 1) {
          puts("Invalid configuration file.");
        }
        pcVar6 = fgets3((FILE *)__stream,line,0x100);
        if (pcVar6 == (char *)0x0) {
          puts("Invalid configuration file.");
        }
        iVar4 = __isoc99_sscanf(line,"%d",(long)pLIRMIA3->InitPWs + lVar5);
        if (iVar4 != 1) {
          puts("Invalid configuration file.");
        }
        pcVar6 = fgets3((FILE *)__stream,line,0x100);
        if (pcVar6 == (char *)0x0) {
          puts("Invalid configuration file.");
        }
        iVar4 = __isoc99_sscanf(line,"%d",(long)pLIRMIA3->ThresholdPWs + lVar5);
        if (iVar4 != 1) {
          puts("Invalid configuration file.");
        }
        pcVar6 = fgets3((FILE *)__stream,line,0x100);
        if (pcVar6 == (char *)0x0) {
          puts("Invalid configuration file.");
        }
        iVar4 = __isoc99_sscanf(line,"%lf",(pLIRMIA3->RS232Port).szDevPath + local_160 + -0x10);
        if (iVar4 != 1) {
          puts("Invalid configuration file.");
        }
        pcVar6 = fgets3((FILE *)__stream,line,0x100);
        if (pcVar6 == (char *)0x0) {
          puts("Invalid configuration file.");
        }
        iVar4 = __isoc99_sscanf(line,"%d",(long)pLIRMIA3->bProportionalPWs + lVar5);
        if (iVar4 != 1) {
          puts("Invalid configuration file.");
        }
        local_160 = local_160 + 8;
      }
      if (pcVar6 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar4 = __isoc99_sscanf(line,"%d",&pLIRMIA3->rightthrusterchan);
      if (iVar4 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar6 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar6 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar4 = __isoc99_sscanf(line,"%d",&pLIRMIA3->leftthrusterchan);
      if (iVar4 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar6 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar6 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar4 = __isoc99_sscanf(line,"%d",&pLIRMIA3->frontthrusterchan);
      if (iVar4 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar6 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar6 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar4 = __isoc99_sscanf(line,"%d",&pLIRMIA3->rearthrusterchan);
      if (iVar4 != 1) {
        puts("Invalid configuration file.");
      }
      iVar4 = fclose(__stream);
      if (iVar4 != 0) {
        puts("fclose() failed.");
      }
    }
  }
  if (pLIRMIA3->threadperiod < 0) {
    puts("Invalid parameter : threadperiod.");
    pLIRMIA3->threadperiod = 0x32;
  }
  lVar5 = 0x150;
  do {
    if (lVar5 == 0x154) {
      if (3 < (uint)pLIRMIA3->rightthrusterchan) {
        puts("Invalid parameter : rightthrusterchan.");
        pLIRMIA3->rightthrusterchan = 1;
      }
      if (3 < (uint)pLIRMIA3->leftthrusterchan) {
        puts("Invalid parameter : leftthrusterchan.");
        pLIRMIA3->leftthrusterchan = 0;
      }
      if (3 < (uint)pLIRMIA3->frontthrusterchan) {
        puts("Invalid parameter : frontthrusterchan.");
        pLIRMIA3->frontthrusterchan = 2;
      }
      if (3 < (uint)pLIRMIA3->rearthrusterchan) {
        puts("Invalid parameter : rearthrusterchan.");
        pLIRMIA3->rearthrusterchan = 3;
      }
      for (lVar5 = 200; lVar5 != 0xcc; lVar5 = lVar5 + 1) {
        pcVar6 = (pLIRMIA3->RS232Port).szDevPath + lVar5 * 4 + -0x10;
        pcVar6[0] = '\0';
        pcVar6[1] = '\0';
        pcVar6[2] = '\0';
        pcVar6[3] = '\0';
      }
      iVar4 = OpenRS232Port(&pLIRMIA3->RS232Port,pLIRMIA3->szDevPath);
      if (iVar4 == 0) {
        iVar4 = SetOptionsRS232Port(&pLIRMIA3->RS232Port,pLIRMIA3->BaudRate,'\0',0,'\b','\0',
                                    pLIRMIA3->timeout);
        if (iVar4 == 0) {
          iVar4 = InitLIRMIA3(pLIRMIA3);
          if (iVar4 == 0) {
            puts("LIRMIA3 connected.");
            return 0;
          }
          pcVar6 = "Unable to connect to LIRMIA3 : Initialization failure.";
        }
        else {
          pcVar6 = "Unable to connect to a LIRMIA3.";
        }
        puts(pcVar6);
        CloseRS232Port(&pLIRMIA3->RS232Port);
      }
      else {
        puts("Unable to connect to a LIRMIA3.");
      }
      return 1;
    }
    uVar1 = *(uint *)((pLIRMIA3->RS232Port).szDevPath + lVar5 * 4 + -0x10);
    if (((uVar1 - 0x9c5 < 0xfffff82f) ||
        (uVar2 = *(uint *)((pLIRMIA3->RS232Port).szDevPath + lVar5 * 4), uVar2 - 0x9c5 < 0xfffff82f)
        ) || (uVar3 = *(uint *)((pLIRMIA3->RS232Port).szDevPath + lVar5 * 4 + 0x10),
             uVar3 - 0x9c5 < 0xfffff82f)) {
LAB_00189a35:
      printf("Invalid parameters : channel %d.\n",(ulong)((int)lVar5 - 0x150));
      pcVar6 = (pLIRMIA3->RS232Port).szDevPath + lVar5 * 4 + -0x10;
      pcVar6[0] = -0x18;
      pcVar6[1] = '\x03';
      pcVar6[2] = '\0';
      pcVar6[3] = '\0';
      pcVar6 = (pLIRMIA3->RS232Port).szDevPath + lVar5 * 4;
      pcVar6[0] = -0x24;
      pcVar6[1] = '\x05';
      pcVar6[2] = '\0';
      pcVar6[3] = '\0';
      pcVar6 = (pLIRMIA3->RS232Port).szDevPath + lVar5 * 4 + 0x10;
      pcVar6[0] = -0x30;
      pcVar6[1] = '\a';
      pcVar6[2] = '\0';
      pcVar6[3] = '\0';
      pcVar6 = (pLIRMIA3->RS232Port).szDevPath + lVar5 * 4 + 0x20;
      pcVar6[0] = -0x24;
      pcVar6[1] = '\x05';
      pcVar6[2] = '\0';
      pcVar6[3] = '\0';
      pcVar6 = (pLIRMIA3->RS232Port).szDevPath + lVar5 * 4 + 0x30;
      pcVar6[0] = '\0';
      pcVar6[1] = '\0';
      pcVar6[2] = '\0';
      pcVar6[3] = '\0';
      *(undefined8 *)((long)pLIRMIA3 + lVar5 * 8 + -0x4f0) = 0x3ff0000000000000;
      pcVar6 = (pLIRMIA3->RS232Port).szDevPath + lVar5 * 4 + 0x60;
      pcVar6[0] = '\x01';
      pcVar6[1] = '\0';
      pcVar6[2] = '\0';
      pcVar6[3] = '\0';
    }
    else {
      iVar4 = *(int *)((pLIRMIA3->RS232Port).szDevPath + lVar5 * 4 + 0x20);
      if (iVar4 != 0) {
        if (((uVar2 <= uVar3) && (uVar1 <= uVar2)) &&
           ((iVar4 <= (int)uVar3 && (((int)uVar1 <= iVar4 && (0xfffff82e < iVar4 - 0x9c5U))))))
        goto LAB_00189abb;
        goto LAB_00189a35;
      }
      if (uVar3 < uVar2 || uVar2 < uVar1) goto LAB_00189a35;
LAB_00189abb:
      if (*(int *)((pLIRMIA3->RS232Port).szDevPath + lVar5 * 4 + 0x30) < 0) goto LAB_00189a35;
    }
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

inline int ConnectLIRMIA3(LIRMIA3* pLIRMIA3, char* szCfgFilePath)
{
	FILE* file = NULL;
	char line[256];
	int channel = 0;

	memset(pLIRMIA3->szCfgFilePath, 0, sizeof(pLIRMIA3->szCfgFilePath));
	sprintf(pLIRMIA3->szCfgFilePath, "%.255s", szCfgFilePath);

	// If szCfgFilePath starts with "hardcoded://", parameters are assumed to be already set in the structure, 
	// otherwise it should be loaded from a configuration file.
	if (strncmp(szCfgFilePath, "hardcoded://", strlen("hardcoded://")) != 0)
	{
		memset(line, 0, sizeof(line));

		// Default values.
		memset(pLIRMIA3->szDevPath, 0, sizeof(pLIRMIA3->szDevPath));
		sprintf(pLIRMIA3->szDevPath, "COM1");
		pLIRMIA3->BaudRate = 115200;
		pLIRMIA3->timeout = 1000;
		pLIRMIA3->threadperiod = 50;
		pLIRMIA3->bSaveRawData = 1;
		for (channel = 0; channel < NB_CHANNELS_PWM_LIRMIA3; channel++)
		{
			pLIRMIA3->MinPWs[channel] = 1000;
			pLIRMIA3->MidPWs[channel] = 1500;
			pLIRMIA3->MaxPWs[channel] = 2000;
			pLIRMIA3->InitPWs[channel] = 1500;
			pLIRMIA3->ThresholdPWs[channel] = 0;
			pLIRMIA3->CoefPWs[channel] = 1;
			pLIRMIA3->bProportionalPWs[channel] = 1;
		}
		pLIRMIA3->rightthrusterchan = 3;
		pLIRMIA3->leftthrusterchan = 2;
		pLIRMIA3->frontthrusterchan = 0;
		pLIRMIA3->rearthrusterchan = 1;

		// Load data from a file.
		file = fopen(szCfgFilePath, "r");
		if (file != NULL)
		{
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%255s", pLIRMIA3->szDevPath) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pLIRMIA3->BaudRate) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pLIRMIA3->timeout) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pLIRMIA3->threadperiod) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pLIRMIA3->bSaveRawData) != 1) printf("Invalid configuration file.\n");

			for (channel = 0; channel < NB_CHANNELS_PWM_LIRMIA3; channel++)
			{
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%d", &pLIRMIA3->MinPWs[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%d", &pLIRMIA3->MidPWs[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%d", &pLIRMIA3->MaxPWs[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%d", &pLIRMIA3->InitPWs[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%d", &pLIRMIA3->ThresholdPWs[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%lf", &pLIRMIA3->CoefPWs[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%d", &pLIRMIA3->bProportionalPWs[channel]) != 1) printf("Invalid configuration file.\n");
			}

			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pLIRMIA3->rightthrusterchan) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pLIRMIA3->leftthrusterchan) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pLIRMIA3->frontthrusterchan) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pLIRMIA3->rearthrusterchan) != 1) printf("Invalid configuration file.\n");

			if (fclose(file) != EXIT_SUCCESS) printf("fclose() failed.\n");
		}
		else
		{
			printf("Configuration file not found.\n");
		}
	}

	if (pLIRMIA3->threadperiod < 0)
	{
		printf("Invalid parameter : threadperiod.\n");
		pLIRMIA3->threadperiod = 50;
	}

	for (channel = 0; channel < NB_CHANNELS_PWM_LIRMIA3; channel++)
	{
		if (
			(pLIRMIA3->MinPWs[channel] < DEFAULT_ABSOLUTE_MIN_PW_LIRMIA3)||(pLIRMIA3->MinPWs[channel] > DEFAULT_ABSOLUTE_MAX_PW_LIRMIA3)||
			(pLIRMIA3->MidPWs[channel] < DEFAULT_ABSOLUTE_MIN_PW_LIRMIA3)||(pLIRMIA3->MidPWs[channel] > DEFAULT_ABSOLUTE_MAX_PW_LIRMIA3)||
			(pLIRMIA3->MaxPWs[channel] < DEFAULT_ABSOLUTE_MIN_PW_LIRMIA3)||(pLIRMIA3->MaxPWs[channel] > DEFAULT_ABSOLUTE_MAX_PW_LIRMIA3)
			||(
			(pLIRMIA3->InitPWs[channel] != 0)&&
			((pLIRMIA3->InitPWs[channel] < DEFAULT_ABSOLUTE_MIN_PW_LIRMIA3)||(pLIRMIA3->InitPWs[channel] > DEFAULT_ABSOLUTE_MAX_PW_LIRMIA3)||
			(pLIRMIA3->MinPWs[channel] > pLIRMIA3->InitPWs[channel])||(pLIRMIA3->InitPWs[channel] > pLIRMIA3->MaxPWs[channel]))			
			)||
			(pLIRMIA3->MinPWs[channel] > pLIRMIA3->MidPWs[channel])||(pLIRMIA3->MidPWs[channel] > pLIRMIA3->MaxPWs[channel])||
			(pLIRMIA3->ThresholdPWs[channel] < 0)
			)
		{
			printf("Invalid parameters : channel %d.\n", channel);
			pLIRMIA3->MinPWs[channel] = 1000;
			pLIRMIA3->MidPWs[channel] = 1500;
			pLIRMIA3->MaxPWs[channel] = 2000;
			pLIRMIA3->InitPWs[channel] = 1500;
			pLIRMIA3->ThresholdPWs[channel] = 0;
			pLIRMIA3->CoefPWs[channel] = 1;
			pLIRMIA3->bProportionalPWs[channel] = 1;
		}
	}
	if ((pLIRMIA3->rightthrusterchan < 0)||(pLIRMIA3->rightthrusterchan >= NB_CHANNELS_PWM_LIRMIA3))
	{
		printf("Invalid parameter : rightthrusterchan.\n");
		pLIRMIA3->rightthrusterchan = 1;
	}
	if ((pLIRMIA3->leftthrusterchan < 0)||(pLIRMIA3->leftthrusterchan >= NB_CHANNELS_PWM_LIRMIA3))
	{
		printf("Invalid parameter : leftthrusterchan.\n");
		pLIRMIA3->leftthrusterchan = 0;
	}
	if ((pLIRMIA3->frontthrusterchan < 0)||(pLIRMIA3->frontthrusterchan >= NB_CHANNELS_PWM_LIRMIA3))
	{
		printf("Invalid parameter : frontthrusterchan.\n");
		pLIRMIA3->frontthrusterchan = 2;
	}
	if ((pLIRMIA3->rearthrusterchan < 0)||(pLIRMIA3->rearthrusterchan >= NB_CHANNELS_PWM_LIRMIA3))
	{
		printf("Invalid parameter : rearthrusterchan.\n");
		pLIRMIA3->rearthrusterchan = 3;
	}

	// Used to save raw data, should be handled specifically...
	//pLIRMIA3->pfSaveFile = NULL;

	for (channel = 0; channel < NB_CHANNELS_PWM_LIRMIA3; channel++)
	{
		pLIRMIA3->LastPWs[channel] = 0;
	}

	if (OpenRS232Port(&pLIRMIA3->RS232Port, pLIRMIA3->szDevPath) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a LIRMIA3.\n");
		return EXIT_FAILURE;
	}

	if (SetOptionsRS232Port(&pLIRMIA3->RS232Port, pLIRMIA3->BaudRate, NOPARITY, FALSE, 8, 
		ONESTOPBIT, (UINT)pLIRMIA3->timeout) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a LIRMIA3.\n");
		CloseRS232Port(&pLIRMIA3->RS232Port);
		return EXIT_FAILURE;
	}

	if (InitLIRMIA3(pLIRMIA3) != EXIT_SUCCESS)
	{
		printf("Unable to connect to LIRMIA3 : Initialization failure.\n");
		CloseRS232Port(&pLIRMIA3->RS232Port);
		return EXIT_FAILURE;
	}

	printf("LIRMIA3 connected.\n");

	return EXIT_SUCCESS;
}